

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::CreateContextCase::executeForConfig
          (CreateContextCase *this,EGLDisplay display,EGLConfig config)

{
  deUint32 dVar1;
  deBool dVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_4f0;
  char *local_370;
  Hex<16UL> local_368;
  MessageBuilder local_360;
  int local_1dc;
  void *pvStack_1d8;
  EGLenum err;
  EGLContext context;
  MessageBuilder local_1c0;
  int local_3c;
  uint local_38;
  int apiNdx;
  EGLint apiBits;
  EGLint id;
  TestLog *log;
  Library *egl;
  EGLConfig config_local;
  EGLDisplay display_local;
  CreateContextCase *this_local;
  
  egl = (Library *)config;
  config_local = display;
  display_local = this;
  log = (TestLog *)
        EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  _apiBits = tcu::TestContext::getLog
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
  apiNdx = eglu::getConfigAttribInt((Library *)log,config_local,egl,0x3028);
  local_38 = eglu::getConfigAttribInt((Library *)log,config_local,egl,0x3040);
  for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
    if ((local_38 & *(uint *)(s_apis + (long)local_3c * 0x18 + 0xc)) != 0) {
      tcu::TestLog::operator<<(&local_1c0,_apiBits,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_1c0,(char (*) [10])"Creating ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char **)(s_apis + (long)local_3c * 0x18));
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [25])" context with config ID ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&apiNdx);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c0);
      dVar1 = (*(code *)log->m_log[6].lock)();
      eglu::checkError(dVar1,"init",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
                       ,0x5d);
      do {
        (**(code **)log->m_log)(log,*(undefined4 *)(s_apis + (long)local_3c * 0x18 + 8));
        dVar1 = (*(code *)log->m_log[6].lock)();
        eglu::checkError(dVar1,"bindAPI(s_apis[apiNdx].api)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
                         ,0x5f);
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pvStack_1d8 = (void *)(*(code *)log->m_log[1].lock)
                                      (log,config_local,egl,0,
                                       *(undefined8 *)(s_apis + (long)local_3c * 0x18 + 0x10));
      local_1dc = (*(code *)log->m_log[6].lock)();
      if ((pvStack_1d8 == (void *)0x0) || (local_1dc != 0x3000)) {
        tcu::TestLog::operator<<(&local_360,_apiBits,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar3 = tcu::MessageBuilder::operator<<(&local_360,(char (*) [18])"  Fail, context: ");
        local_368 = tcu::toHex<void_*>(pvStack_1d8);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_368);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [10])", error: ");
        local_370 = eglu::getErrorName(local_1dc);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_370);
        tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_360);
        tcu::TestContext::setTestResult
                  ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Failed to create context");
      }
      else {
        do {
          (**(code **)&log->m_log[3].isSessionOpen)(log,config_local,pvStack_1d8);
          dVar1 = (*(code *)log->m_log[6].lock)();
          eglu::checkError(dVar1,"destroyContext(display, context)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
                           ,0x6c);
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
        tcu::TestLog::operator<<(&local_4f0,_apiBits,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar3 = tcu::MessageBuilder::operator<<(&local_4f0,(char (*) [7])"  Pass");
        tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_4f0);
      }
    }
  }
  return;
}

Assistant:

void CreateContextCase::executeForConfig (EGLDisplay display, EGLConfig config)
{
	const Library&	egl		= m_eglTestCtx.getLibrary();
	TestLog&		log		= m_testCtx.getLog();
	EGLint			id		= eglu::getConfigAttribInt(egl, display, config, EGL_CONFIG_ID);
	EGLint			apiBits	= eglu::getConfigAttribInt(egl, display, config, EGL_RENDERABLE_TYPE);

	for (int apiNdx = 0; apiNdx < (int)DE_LENGTH_OF_ARRAY(s_apis); apiNdx++)
	{
		if ((apiBits & s_apis[apiNdx].apiBit) == 0)
			continue; // Not supported API

		log << TestLog::Message << "Creating " << s_apis[apiNdx].name << " context with config ID " << id << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "init");

		EGLU_CHECK_CALL(egl, bindAPI(s_apis[apiNdx].api));

		EGLContext	context = egl.createContext(display, config, EGL_NO_CONTEXT, s_apis[apiNdx].ctxAttrs);
		EGLenum		err		= egl.getError();

		if (context == EGL_NO_CONTEXT || err != EGL_SUCCESS)
		{
			log << TestLog::Message << "  Fail, context: " << tcu::toHex(context) << ", error: " << eglu::getErrorName(err) << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to create context");
		}
		else
		{
			// Destroy
			EGLU_CHECK_CALL(egl, destroyContext(display, context));
			log << TestLog::Message << "  Pass" << TestLog::EndMessage;
		}
	}
}